

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprDataType(Expr *pExpr)

{
  byte bVar1;
  ExprList *pEVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ExprList *pEVar7;
  int iVar8;
  
  uVar5 = 0;
  do {
    if (pExpr == (Expr *)0x0) {
      uVar6 = 0;
switchD_001873fd_caseD_9c:
      return uVar5 | uVar6;
    }
    bVar1 = pExpr->op;
    uVar6 = 1;
    if (bVar1 < 0x7a) {
      if (bVar1 < 0x72) {
        if (bVar1 == 0x24) {
switchD_001873fd_caseD_a8:
          cVar3 = sqlite3ExprAffinity(pExpr);
          uVar6 = 5;
          if (cVar3 < 'C') {
            uVar6 = cVar3 == 'B' ^ 7;
          }
        }
        else if (bVar1 == 0x70) {
          uVar6 = 6;
        }
      }
      else {
        if (bVar1 == 0x72) goto switchD_001873fd_caseD_ad;
        if (bVar1 == 0x76) {
          uVar6 = 2;
        }
      }
      goto switchD_001873fd_caseD_9c;
    }
    switch(bVar1) {
    case 0x9b:
      uVar6 = 4;
    case 0x9c:
    case 0x9f:
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xab:
    case 0xae:
    case 0xaf:
    case 0xb0:
      goto switchD_001873fd_caseD_9c;
    case 0x9d:
    case 0xa9:
    case 0xac:
      uVar6 = 7;
      goto switchD_001873fd_caseD_9c;
    case 0x9e:
      pEVar2 = (pExpr->x).pList;
      uVar4 = pEVar2->nExpr;
      uVar6 = 0;
      if (1 < (int)uVar4) {
        pEVar7 = pEVar2 + 1;
        uVar6 = 0;
        iVar8 = 1;
        do {
          uVar4 = sqlite3ExprDataType(*(Expr **)pEVar7);
          uVar6 = uVar6 | uVar4;
          uVar4 = pEVar2->nExpr;
          pEVar7 = (ExprList *)&pEVar7[1].a[0].zEName;
          iVar8 = iVar8 + 2;
        } while (iVar8 < (int)uVar4);
      }
      if ((uVar4 & 1) == 0) goto switchD_001873fd_caseD_9c;
      pExpr = pEVar2->a[(int)(uVar4 - 1)].pExpr;
      uVar5 = uVar5 | uVar6;
      break;
    case 0xa8:
    case 0xaa:
    case 0xb1:
    case 0xb2:
      goto switchD_001873fd_caseD_a8;
    case 0xad:
    case 0xb3:
switchD_001873fd_caseD_ad:
      pExpr = pExpr->pLeft;
      break;
    default:
      if (bVar1 != 0x7a) {
        if (bVar1 == 0x8b) goto switchD_001873fd_caseD_a8;
        goto switchD_001873fd_caseD_9c;
      }
      pExpr = (Expr *)0x0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprDataType(const Expr *pExpr){
  while( pExpr ){
    switch( pExpr->op ){
      case TK_COLLATE:
      case TK_IF_NULL_ROW:
      case TK_UPLUS:  {
        pExpr = pExpr->pLeft;
        break;
      }
      case TK_NULL: {
        pExpr = 0;
        break;
      }
      case TK_STRING: {
        return 0x02;
      }
      case TK_BLOB: {
        return 0x04;
      }
      case TK_CONCAT: {
        return 0x06;
      }
      case TK_VARIABLE:
      case TK_AGG_FUNCTION:
      case TK_FUNCTION: {
        return 0x07;
      }
      case TK_COLUMN:
      case TK_AGG_COLUMN:
      case TK_SELECT:
      case TK_CAST:
      case TK_SELECT_COLUMN:
      case TK_VECTOR:  {
        int aff = sqlite3ExprAffinity(pExpr);
        if( aff>=SQLITE_AFF_NUMERIC ) return 0x05;
        if( aff==SQLITE_AFF_TEXT )    return 0x06;
        return 0x07;
      }
      case TK_CASE: {
        int res = 0;
        int ii;
        ExprList *pList = pExpr->x.pList;
        assert( ExprUseXList(pExpr) && pList!=0 );
        assert( pList->nExpr > 0);
        for(ii=1; ii<pList->nExpr; ii+=2){
          res |= sqlite3ExprDataType(pList->a[ii].pExpr);
        }
        if( pList->nExpr % 2 ){
          res |= sqlite3ExprDataType(pList->a[pList->nExpr-1].pExpr);
        }
        return res;
      }
      default: {
        return 0x01;
      }
    } /* End of switch(op) */
  } /* End of while(pExpr) */
  return 0x00;
}